

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLoadXYZROTnodeXYZROTnodeBushingMate::ComputeForceTorque
          (ChLoadXYZROTnodeXYZROTnodeBushingMate *this,ChFrameMoving<double> *rel_AB,
          ChVector<double> *loc_force,ChVector<double> *loc_torque)

{
  double dVar1;
  bool bVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  double dVar8;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  double local_38;
  double dStack_30;
  double local_28;
  undefined1 auVar9 [16];
  
  ChLoadXYZROTnodeXYZROTnodeBushingSpherical::ComputeForceTorque
            (&this->super_ChLoadXYZROTnodeXYZROTnodeBushingSpherical,rel_AB,loc_force,loc_torque);
  auVar9 = *(undefined1 (*) [16])((rel_AB->super_ChFrame<double>).coord.rot.m_data + 1);
  dVar18 = (rel_AB->super_ChFrame<double>).coord.rot.m_data[3];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar18;
  dVar14 = 0.0;
  dVar13 = auVar9._0_8_;
  auVar11._0_8_ = dVar13 * dVar13;
  dVar8 = auVar9._8_8_;
  auVar11._8_8_ = dVar8 * dVar8;
  auVar11 = vshufpd_avx(auVar11,auVar11,1);
  auVar9 = vfmadd231sd_fma(auVar11,auVar9,auVar9);
  auVar9 = vfmadd231sd_fma(auVar9,auVar15,auVar15);
  if (auVar9._0_8_ <= 0.0) {
    dVar8 = 1.0;
    dVar18 = 0.0;
    dVar13 = 0.0;
    goto LAB_0063ec82;
  }
  auVar9 = vsqrtsd_avx(auVar9,auVar9);
  dVar10 = atan2(auVar9._0_8_,(rel_AB->super_ChFrame<double>).coord.rot.m_data[0]);
  dVar10 = dVar10 + dVar10;
  dVar14 = 1.0 / auVar9._0_8_;
  dVar18 = dVar14 * dVar18;
  auVar16._0_8_ = dVar14 * dVar13;
  auVar16._8_8_ = dVar14 * dVar8;
  auVar9._0_8_ = auVar16._0_8_ * auVar16._0_8_;
  auVar9._8_8_ = auVar16._8_8_ * auVar16._8_8_;
  auVar9 = vshufpd_avx(auVar9,auVar9,1);
  auVar9 = vfmadd231sd_fma(auVar9,auVar16,auVar16);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar18;
  auVar9 = vfmadd231sd_fma(auVar9,auVar19,auVar19);
  auVar9 = vsqrtsd_avx(auVar9,auVar9);
  dVar8 = auVar9._0_8_;
  dVar13 = 1.0 / dVar8;
  uVar7 = 0xff;
  if (dVar8 < 2.2250738585072014e-308) {
    uVar7 = 0;
  }
  auVar17._8_8_ = dVar13;
  auVar17._0_8_ = dVar13;
  dVar14 = (double)((ulong)(2.2250738585072014e-308 <= dVar8) * (long)(dVar18 * dVar13));
  if (dVar10 <= 3.141592653589793) {
    if (dVar10 < -3.141592653589793) {
      dVar18 = 6.283185307179586;
      goto LAB_0063ec49;
    }
  }
  else {
    dVar18 = -6.283185307179586;
LAB_0063ec49:
    dVar10 = dVar10 + dVar18;
  }
  auVar9 = vmulpd_avx512vl(auVar16,auVar17);
  bVar2 = (bool)((byte)uVar7 & 1);
  dVar8 = (double)((ulong)bVar2 * auVar9._0_8_ | (ulong)!bVar2 * 0x3ff0000000000000);
  dVar18 = (double)((ulong)((byte)(uVar7 >> 1) & 1) * auVar9._8_8_);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar10;
  uVar3 = vcmpsd_avx512f(auVar12,ZEXT816(0x400921fb54442d18),0xe);
  bVar2 = (bool)((byte)uVar3 & 1);
  dVar13 = (double)((ulong)bVar2 * (long)(dVar10 + -6.283185307179586) +
                   (ulong)!bVar2 * (long)dVar10);
  if (dVar13 < -3.141592653589793) {
    dVar13 = dVar13 + 6.283185307179586;
  }
LAB_0063ec82:
  dVar10 = (this->rot_stiffness).m_data[2];
  dVar4 = (this->rot_stiffness).m_data[0];
  dVar5 = (this->rot_stiffness).m_data[1];
  ChFrameMoving<double>::GetWvel_par(rel_AB);
  dVar1 = (this->rot_damping).m_data[2];
  dVar6 = (this->rot_damping).m_data[1];
  loc_torque->m_data[0] = local_38 * (this->rot_damping).m_data[0] + dVar8 * dVar13 * dVar4;
  loc_torque->m_data[1] = dStack_30 * dVar6 + dVar18 * dVar13 * dVar5;
  loc_torque->m_data[2] = local_28 * dVar1 + dVar14 * dVar13 * dVar10;
  return;
}

Assistant:

void ChLoadXYZROTnodeXYZROTnodeBushingMate::ComputeForceTorque(const ChFrameMoving<>& rel_AB,
                                                               ChVector<>& loc_force,
                                                               ChVector<>& loc_torque) {
    // inherit parent to compute loc_force = ...
    ChLoadXYZROTnodeXYZROTnodeBushingSpherical::ComputeForceTorque(rel_AB, loc_force, loc_torque);

    // compute local torque using small rotations:
    ChQuaternion<> rel_rot = rel_AB.GetRot();

    ChVector<> dir_rot;
    double angle_rot;
    rel_rot.Q_to_AngAxis(angle_rot, dir_rot);
    if (angle_rot > CH_C_PI)
        angle_rot -= CH_C_2PI;
    if (angle_rot < -CH_C_PI)
        angle_rot += CH_C_2PI;
    ChVector<> vect_rot = dir_rot * angle_rot;

    loc_torque = vect_rot * rot_stiffness               // element-wise product!
                 + rel_AB.GetWvel_par() * rot_damping;  // element-wise product!
}